

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O1

void __thiscall ON_BezierCurve::Destroy(ON_BezierCurve *this)

{
  if ((this->m_cv != (double *)0x0) && (0 < this->m_cv_capacity)) {
    onfree(this->m_cv);
  }
  *(undefined8 *)&this->m_cv_stride = 0;
  *(undefined8 *)((long)&this->m_cv + 4) = 0;
  this->m_dim = 0;
  this->m_is_rat = 0;
  this->m_order = 0;
  this->m_cv_stride = 0;
  return;
}

Assistant:

void ON_BezierCurve::Destroy()
{
  if ( m_cv && m_cv_capacity > 0 )
    onfree(m_cv);
  m_cv_capacity = 0;
  m_cv_stride = 0;
  m_cv = 0;
  m_dim = 0;
  m_is_rat = 0;
  m_order = 0;
  //m_domain.m_t[0] = 0.0;
  //m_domain.m_t[1] = 1.0;
}